

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O0

string * __thiscall
XrSdkLogObjectInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,XrSdkLogObjectInfo *this)

{
  ulong uVar1;
  ostream *poVar2;
  string local_1b0;
  ostringstream local_190 [8];
  ostringstream oss;
  XrSdkLogObjectInfo *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  Uint64ToHexString_abi_cxx11_(&local_1b0,this->handle);
  std::operator<<((ostream *)local_190,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)local_190," (");
    poVar2 = std::operator<<(poVar2,(string *)&this->name);
    std::operator<<(poVar2,")");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string XrSdkLogObjectInfo::ToString() const {
    std::ostringstream oss;
    oss << Uint64ToHexString(handle);
    if (!name.empty()) {
        oss << " (" << name << ")";
    }
    return oss.str();
}